

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

boolean first_marker(j_decompress_ptr cinfo)

{
  byte bVar1;
  jpeg_source_mgr *pjVar2;
  boolean bVar3;
  uint uVar4;
  size_t local_38;
  size_t bytes_in_buffer;
  JOCTET *next_input_byte;
  jpeg_source_mgr *datasrc;
  int c2;
  int c;
  j_decompress_ptr cinfo_local;
  
  pjVar2 = cinfo->src;
  bytes_in_buffer = (size_t)pjVar2->next_input_byte;
  local_38 = pjVar2->bytes_in_buffer;
  if (local_38 == 0) {
    bVar3 = (*pjVar2->fill_input_buffer)(cinfo);
    if (bVar3 == 0) {
      return 0;
    }
    bytes_in_buffer = (size_t)pjVar2->next_input_byte;
    local_38 = pjVar2->bytes_in_buffer;
  }
  local_38 = local_38 - 1;
  bVar1 = *(byte *)bytes_in_buffer;
  bytes_in_buffer = bytes_in_buffer + 1;
  if (local_38 == 0) {
    bVar3 = (*pjVar2->fill_input_buffer)(cinfo);
    if (bVar3 == 0) {
      return 0;
    }
    bytes_in_buffer = (size_t)pjVar2->next_input_byte;
    local_38 = pjVar2->bytes_in_buffer;
  }
  uVar4 = (uint)*(byte *)bytes_in_buffer;
  if ((bVar1 != 0xff) || (uVar4 != 0xd8)) {
    cinfo->err->msg_code = 0x37;
    (cinfo->err->msg_parm).i[0] = (uint)bVar1;
    (cinfo->err->msg_parm).i[1] = uVar4;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  cinfo->unread_marker = uVar4;
  pjVar2->next_input_byte = (JOCTET *)(bytes_in_buffer + 1);
  pjVar2->bytes_in_buffer = local_38 - 1;
  return 1;
}

Assistant:

LOCAL(boolean)
first_marker (j_decompress_ptr cinfo)
/* Like next_marker, but used to obtain the initial SOI marker. */
/* For this marker, we do not allow preceding garbage or fill; otherwise,
 * we might well scan an entire input file before realizing it ain't JPEG.
 * If an application wants to process non-JFIF files, it must seek to the
 * SOI before calling the JPEG library.
 */
{
  int c, c2;
  INPUT_VARS(cinfo);

  INPUT_BYTE(cinfo, c, return FALSE);
  INPUT_BYTE(cinfo, c2, return FALSE);
  if (c != 0xFF || c2 != (int) M_SOI)
    ERREXIT2(cinfo, JERR_NO_SOI, c, c2);

  cinfo->unread_marker = c2;

  INPUT_SYNC(cinfo);
  return TRUE;
}